

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

void find_tag_name(StringRef *tag,char **name,size_t *len,int *is_end_tag)

{
  int iVar1;
  uint uVar2;
  uint *in_RCX;
  long *in_RDX;
  long *in_RSI;
  StringRef *in_RDI;
  bool bVar3;
  char *p;
  char *local_28;
  
  local_28 = StringRef::get(in_RDI);
  while (iVar1 = isspace((int)*local_28), iVar1 != 0) {
    local_28 = local_28 + 1;
  }
  uVar2 = (uint)(*local_28 == '/');
  *in_RCX = uVar2;
  while (uVar2 != 0) {
    local_28 = local_28 + 1;
    uVar2 = isspace((int)*local_28);
  }
  *in_RSI = (long)local_28;
  while( true ) {
    bVar3 = false;
    if (*local_28 != '\0') {
      iVar1 = isspace((int)*local_28);
      bVar3 = iVar1 == 0;
    }
    if (!bVar3) break;
    local_28 = local_28 + 1;
  }
  *in_RDX = (long)local_28 - *in_RSI;
  return;
}

Assistant:

static void find_tag_name(StringRef *tag, const char *&name, size_t &len,
                          int &is_end_tag)
{
    const char *p;

    /* skip leading spaces */
    for (p = tag->get() ; isspace(*p) ; ++p) ;

    /* if it's an end tag, skip the '/' and any intervening spaces */
    if ((is_end_tag = (*p == '/')) != 0)
        for (++p ; isspace(*p) ; ++p) ;

    /* scan the name - it's from here to the next space */
    for (name = p ; *p != '\0' && !isspace(*p) ; ++p) ;

    /* note the length */
    len = p - name;
}